

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void * mi_heap_try_new(mi_heap_t *heap,size_t size,_Bool nothrow)

{
  long lVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  void *pvVar4;
  size_t idx;
  
  do {
    _Var3 = mi_try_new_handler(nothrow);
    if (!_Var3) {
      return (void *)0x0;
    }
    if (size < 0x401) {
      lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
      puVar2 = *(undefined8 **)(lVar1 + 0x10);
      if (puVar2 != (undefined8 *)0x0) {
        *(undefined8 *)(lVar1 + 0x10) = *puVar2;
        *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
        return puVar2;
      }
    }
    pvVar4 = _mi_malloc_generic(heap,size,false,0);
  } while (pvVar4 == (void *)0x0);
  return pvVar4;
}

Assistant:

void* mi_heap_try_new(mi_heap_t* heap, size_t size, bool nothrow ) {
  void* p = NULL;
  while(p == NULL && mi_try_new_handler(nothrow)) {
    p = mi_heap_malloc(heap,size);
  }
  return p;
}